

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask14_24(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  long unaff_RBX;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x483c342c24181008));
  auVar5 = vpmovsxbd_avx(ZEXT416(0x2000804));
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[7] << 2)));
  auVar7 = vpinsrd_avx(auVar8._0_16_,in[7] << 2,2);
  uVar2 = in[0x14];
  auVar4 = vpinsrd_avx(auVar5,auVar8._8_4_ >> 0xc,2);
  auVar5 = vpsrlvd_avx2(auVar8._0_16_,auVar5);
  uVar3 = in[0x16];
  auVar7 = vpor_avx(auVar7,auVar4);
  vpmovsxbd_avx2(ZEXT816(0x4438302820140c04));
  auVar7 = vpblendd_avx2(auVar5,auVar7,4);
  auVar6 = vpsllvd_avx2(auVar8,_DAT_0018e9e0);
  auVar9 = valignd_avx512vl(ZEXT1632(auVar7),ZEXT1632(auVar7),7);
  auVar10 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBX));
  auVar10 = vpsllvd_avx2(auVar10,_DAT_0018e9a0);
  auVar9 = vpblendd_avx2(auVar9,ZEXT432(*in),1);
  auVar7 = vpshufd_avx(auVar8._16_16_,0x50);
  auVar7 = vpsrlvd_avx2(auVar7,_DAT_0019d260);
  auVar11._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar9._0_16_;
  auVar11._16_16_ = ZEXT116(0) * auVar9._16_16_ + ZEXT116(1) * auVar7;
  auVar9 = vpblendd_avx2(auVar9,auVar11,0x60);
  uVar1 = in[0x10];
  auVar12._4_4_ = uVar1;
  auVar12._0_4_ = uVar1;
  auVar12._8_4_ = uVar1;
  auVar12._12_4_ = uVar1;
  auVar12._16_4_ = uVar1;
  auVar12._20_4_ = uVar1;
  auVar12._24_4_ = uVar1;
  auVar12._28_4_ = uVar1;
  auVar9 = vpblendd_avx2(auVar9,auVar12,0x80);
  auVar9 = vpternlogd_avx512vl(auVar6,auVar10,auVar9,0xfe);
  auVar7 = vpshufd_avx(auVar8._16_16_,0xff);
  *(undefined1 (*) [32])out = auVar9;
  auVar7 = vpinsrd_avx(auVar7,uVar2,1);
  auVar4 = vpinsrd_avx(ZEXT416(uVar2),uVar3,1);
  auVar5 = vpsrlvd_avx2(auVar7,_DAT_00192860);
  auVar4 = vpsllvd_avx2(auVar4,_DAT_0019d270);
  uVar1 = in[0x17];
  auVar7 = vpinsrd_avx(ZEXT416(in[0x13]),in[0x15],1);
  auVar7 = vpsllvd_avx2(auVar7,_DAT_00192270);
  auVar7 = vpternlogd_avx512vl(auVar4,auVar7,auVar5,0xfe);
  *(long *)(out + 8) = auVar7._0_8_;
  out[10] = uVar1 << 2 | uVar3 >> 0xc;
  return out + 0xb;
}

Assistant:

uint32_t *__fastpackwithoutmask14_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (14 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (14 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (14 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (14 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (14 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (14 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (14 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (14 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (14 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;

  return out + 1;
}